

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robot.cpp
# Opt level: O0

void __thiscall
Robot::setdimensions
          (Robot *this,double a1z,double a2x,double a2z,double a3z,double a4x,double a4z,double a5x,
          double a6x)

{
  double a6x_local;
  double a5x_local;
  double a4z_local;
  double a4x_local;
  double a3z_local;
  double a2z_local;
  double a2x_local;
  double a1z_local;
  Robot *this_local;
  
  this->a1z = a1z;
  this->a2x = a2x;
  this->a2z = a2z;
  this->a3z = a3z;
  this->a4x = a4x;
  this->a4z = a4z;
  this->a5x = a5x;
  this->a6x = a6x;
  return;
}

Assistant:

void Robot::setdimensions(
    double a1z,
    double a2x,
    double a2z,
    double a3z,
    double a4x,
    double a4z,
    double a5x,
    double a6x){
    this->a1z = a1z;
    this->a2x = a2x;
    this->a2z = a2z;
    this->a3z = a3z;
    this->a4x = a4x;
    this->a4z = a4z;
    this->a5x = a5x;
    this->a6x = a6x;
}